

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O0

uint64_t duckdb_get_enum_value(duckdb_value value)

{
  LogicalTypeId LVar1;
  bool bVar2;
  LogicalType *this;
  duckdb_value in_RDI;
  Value val;
  Value *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  Value *this_00;
  Value local_50;
  Value *local_8;
  
  if (in_RDI != (duckdb_value)0x0) {
    UnwrapValue(in_RDI);
    this_00 = &local_50;
    duckdb::Value::Value
              (this_00,(Value *)CONCAT17(in_stack_ffffffffffffff8f,
                                         CONCAT16(in_stack_ffffffffffffff8e,
                                                  in_stack_ffffffffffffff88)));
    this = duckdb::Value::type(this_00);
    LVar1 = duckdb::LogicalType::id(this);
    if ((LVar1 != ENUM) || (bVar2 = duckdb::Value::IsNull(&local_50), bVar2)) {
      local_8 = (Value *)0x0;
    }
    else {
      in_stack_ffffffffffffff80 =
           (Value *)duckdb::Value::GetValue<unsigned_long>((Value *)0x19117ee);
      local_8 = in_stack_ffffffffffffff80;
    }
    duckdb::Value::~Value(in_stack_ffffffffffffff80);
    return (uint64_t)local_8;
  }
  return 0;
}

Assistant:

uint64_t duckdb_get_enum_value(duckdb_value value) {
	if (!value) {
		return 0;
	}

	auto val = UnwrapValue(value);
	if (val.type().id() != LogicalTypeId::ENUM || val.IsNull()) {
		return 0;
	}

	return val.GetValue<uint64_t>();
}